

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.cpp
# Opt level: O2

Tuple4d * __thiscall
geometry::primitive::Cube::local_normal
          (Tuple4d *__return_storage_ptr__,Cube *this,Tuple4d *point,Intersection *hit)

{
  double dVar1;
  double *pdVar2;
  int i;
  size_t sVar3;
  undefined8 local_38;
  
  local_38 = 0.0;
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    pdVar2 = math::Tuple4d::operator()(point,sVar3);
    if (local_38 < ABS(*pdVar2)) {
      pdVar2 = math::Tuple4d::operator()(point,sVar3);
      local_38 = ABS(*pdVar2);
    }
  }
  math::vector(__return_storage_ptr__,0.0,0.0,0.0);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    pdVar2 = math::Tuple4d::operator()(point,sVar3);
    if ((local_38 == ABS(*pdVar2)) && (!NAN(local_38) && !NAN(ABS(*pdVar2)))) {
      pdVar2 = math::Tuple4d::operator()(point,sVar3);
      dVar1 = *pdVar2;
      pdVar2 = math::Tuple4d::operator()(__return_storage_ptr__,sVar3);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cube::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double max = 0;
    for (int i = 0; i < 3; i++)
    {
	if (std::abs(point(i)) > max)
	    max = std::abs(point(i));
    }

    math::Tuple4d ret = math::vector(0, 0, 0);
    for (int i = 0; i < 3; i++)
    {
	if (max == std::abs(point(i)))
	    ret(i) = point(i);
    }
    return ret;
}